

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::ArenaData_*,_RealCount>::RemoveElement<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::ArenaData_*,_RealCount> *this,NoThrowHeapAllocator *allocator,
          ArenaData **element)

{
  code *pcVar1;
  bool bVar2;
  ArenaData *pAVar3;
  undefined4 *puVar4;
  ArenaData **buffer;
  
  buffer = element + -2;
  pAVar3 = (ArenaData *)this;
  do {
    pAVar3 = (ArenaData *)
             (((DListBase<Memory::ArenaData_*,_RealCount> *)pAVar3)->
             super_DListNodeBase<Memory::ArenaData_*>).next.node;
    if (pAVar3 == (ArenaData *)this) break;
  } while (pAVar3 != (ArenaData *)buffer);
  if (pAVar3 == (ArenaData *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pAVar3 = *buffer;
  element[-1]->bigBlocks = (BigBlock *)pAVar3;
  pAVar3->fullBlocks = (BigBlock *)element[-1];
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x18);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }